

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O3

TValue * luaH_newkey(lua_State *L,Table *t,TValue *key)

{
  uint uVar1;
  Value VVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  uint uVar5;
  Node *pNVar6;
  Node *pNVar7;
  Node *pNVar8;
  TValue *pTVar9;
  int lg;
  uint uVar10;
  Node *pNVar11;
  long lVar12;
  uint nasize;
  int iVar13;
  int ause;
  int iVar14;
  uint uVar15;
  uint uVar16;
  char *fmt;
  int iVar17;
  int iVar18;
  uint uVar19;
  int iVar20;
  long lVar21;
  int *piVar22;
  Node *pNVar23;
  int iVar24;
  TValue *io2;
  int nums [31];
  int local_b8 [34];
  
  if (key->tt_ == 3) {
    if (!NAN((key->value_).n)) goto LAB_00110a15;
    fmt = "table index is NaN";
  }
  else {
    if (key->tt_ != 0) {
LAB_00110a15:
      pNVar6 = mainposition(t,key);
      if ((pNVar6 == &dummynode_) || (pNVar23 = pNVar6, (pNVar6->i_val).tt_ != 0)) {
        pNVar23 = t->lastfree;
        do {
          pNVar11 = pNVar23;
          if (pNVar11 <= t->node) {
            local_b8[0x1c] = 0;
            local_b8[0x1d] = 0;
            local_b8[0x1e] = 0;
            local_b8[0x18] = 0;
            local_b8[0x19] = 0;
            local_b8[0x1a] = 0;
            local_b8[0x1b] = 0;
            local_b8[0x14] = 0;
            local_b8[0x15] = 0;
            local_b8[0x16] = 0;
            local_b8[0x17] = 0;
            local_b8[0x10] = 0;
            local_b8[0x11] = 0;
            local_b8[0x12] = 0;
            local_b8[0x13] = 0;
            local_b8[0xc] = 0;
            local_b8[0xd] = 0;
            local_b8[0xe] = 0;
            local_b8[0xf] = 0;
            local_b8[8] = 0;
            local_b8[9] = 0;
            local_b8[10] = 0;
            local_b8[0xb] = 0;
            local_b8[4] = 0;
            local_b8[5] = 0;
            local_b8[6] = 0;
            local_b8[7] = 0;
            local_b8[0] = 0;
            local_b8[1] = 0;
            local_b8[2] = 0;
            local_b8[3] = 0;
            iVar13 = t->sizearray;
            lVar12 = 0;
            iVar18 = 1;
            iVar14 = 0;
            iVar24 = 1;
            goto LAB_00110afd;
          }
          pNVar23 = pNVar11 + -1;
          t->lastfree = pNVar23;
        } while (pNVar11[-1].i_key.nk.tt_ != 0);
        pNVar7 = mainposition(t,&(pNVar6->i_key).tvk);
        if (pNVar7 == pNVar6) {
          pNVar11[-1].i_key.nk.next = (pNVar6->i_key).nk.next;
          (pNVar6->i_key).nk.next = pNVar23;
        }
        else {
          do {
            pNVar8 = pNVar7;
            pNVar7 = (pNVar8->i_key).nk.next;
          } while (pNVar7 != pNVar6);
          (pNVar8->i_key).nk.next = pNVar23;
          pNVar11[-1].i_key.nk.next = (pNVar6->i_key).nk.next;
          VVar2 = (pNVar6->i_val).value_;
          iVar13 = (pNVar6->i_val).tt_;
          uVar4 = *(undefined4 *)&(pNVar6->i_val).field_0xc;
          uVar3 = *(undefined8 *)((long)&pNVar6->i_key + 8);
          pNVar11[-1].i_key.nk.value_ = (pNVar6->i_key).nk.value_;
          *(undefined8 *)((long)&pNVar11[-1].i_key + 8) = uVar3;
          (pNVar23->i_val).value_ = VVar2;
          pNVar11[-1].i_val.tt_ = iVar13;
          *(undefined4 *)&pNVar11[-1].i_val.field_0xc = uVar4;
          (pNVar6->i_key).nk.next = (Node *)0x0;
          (pNVar6->i_val).tt_ = 0;
          pNVar23 = pNVar6;
        }
      }
      (pNVar23->i_key).nk.value_ = key->value_;
      uVar5 = key->tt_;
      (pNVar23->i_key).nk.tt_ = uVar5;
      if ((((uVar5 & 0x40) != 0) && (((byte)(key->value_).f[9] & 3) != 0)) && ((t->marked & 4) != 0)
         ) {
        luaC_barrierback_(L,(GCObject *)t);
      }
      return &pNVar23->i_val;
    }
    fmt = "table index is nil";
  }
  luaG_runerror(L,fmt);
  while( true ) {
    iVar20 = 0;
    if (iVar18 <= iVar17) {
      lVar21 = (long)iVar18 + -1;
      piVar22 = &t->array[(long)iVar18 + -1].tt_;
      iVar20 = 0;
      do {
        iVar20 = (iVar20 + 1) - (uint)(*piVar22 == 0);
        lVar21 = lVar21 + 1;
        piVar22 = piVar22 + 4;
      } while (lVar21 < iVar17);
      iVar18 = iVar17 + 1;
    }
    local_b8[lVar12] = local_b8[lVar12] + iVar20;
    iVar14 = iVar14 + iVar20;
    lVar12 = lVar12 + 1;
    iVar24 = iVar24 * 2;
    if (lVar12 == 0x1f) break;
LAB_00110afd:
    iVar17 = iVar24;
    if ((iVar13 < iVar24) && (iVar17 = iVar13, iVar13 < iVar18)) break;
  }
  lVar12 = (ulong)(uint)~(-1 << (t->lsizenode & 0x1f)) * 0x28 + 0x28;
  iVar24 = 0;
  iVar13 = 0;
  do {
    if (*(int *)((long)t->node + lVar12 + -0x20) != 0) {
      iVar18 = countint((TValue *)((long)t->node + lVar12 + -0x18),local_b8);
      iVar13 = iVar13 + iVar18;
      iVar24 = iVar24 + 1;
    }
    lVar12 = lVar12 + -0x28;
  } while (lVar12 != 0);
  piVar22 = local_b8;
  iVar18 = countint(key,piVar22);
  uVar5 = iVar18 + iVar13 + iVar14;
  if (uVar5 == 0 || SCARRY4(iVar18,iVar13 + iVar14) != (int)uVar5 < 0) {
    uVar10 = 0;
    nasize = 0;
  }
  else {
    uVar16 = 0;
    nasize = 0;
    uVar10 = 0;
    uVar19 = 0;
    uVar15 = 1;
    do {
      iVar13 = *piVar22;
      uVar1 = iVar13 + uVar19;
      if (0 < iVar13) {
        uVar19 = uVar1;
      }
      if (0 < iVar13 && (int)uVar16 < (int)uVar1) {
        nasize = uVar15;
        uVar10 = uVar1;
      }
      if (uVar19 == uVar5) break;
      uVar16 = uVar15 & 0x7fffffff;
      piVar22 = piVar22 + 1;
      uVar15 = uVar15 * 2;
    } while (uVar16 < uVar5);
  }
  luaH_resize(L,t,nasize,((iVar14 + iVar24) - uVar10) + 1);
  pTVar9 = luaH_set(L,t,key);
  return pTVar9;
}

Assistant:

TValue *luaH_newkey (lua_State *L, Table *t, const TValue *key) {
  Node *mp;
  if (ttisnil(key)) luaG_runerror(L, "table index is nil");
  else if (ttisnumber(key) && luai_numisnan(L, nvalue(key)))
    luaG_runerror(L, "table index is NaN");
  mp = mainposition(t, key);
  if (!ttisnil(gval(mp)) || isdummy(mp)) {  /* main position is taken? */
    Node *othern;
    Node *n = getfreepos(t);  /* get a free place */
    if (n == NULL) {  /* cannot find a free place? */
      rehash(L, t, key);  /* grow table */
      /* whatever called 'newkey' take care of TM cache and GC barrier */
      return luaH_set(L, t, key);  /* insert key into grown table */
    }
    lua_assert(!isdummy(n));
    othern = mainposition(t, gkey(mp));
    if (othern != mp) {  /* is colliding node out of its main position? */
      /* yes; move colliding node into free position */
      while (gnext(othern) != mp) othern = gnext(othern);  /* find previous */
      gnext(othern) = n;  /* redo the chain with `n' in place of `mp' */
      *n = *mp;  /* copy colliding node into free pos. (mp->next also goes) */
      gnext(mp) = NULL;  /* now `mp' is free */
      setnilvalue(gval(mp));
    }
    else {  /* colliding node is in its own main position */
      /* new node will go into free position */
      gnext(n) = gnext(mp);  /* chain new position */
      gnext(mp) = n;
      mp = n;
    }
  }
  setobj2t(L, gkey(mp), key);
  luaC_barrierback(L, obj2gco(t), key);
  lua_assert(ttisnil(gval(mp)));
  return gval(mp);
}